

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# offline-ekf-flexibility-estimation.hxx
# Opt level: O1

IndexedMatrixArray *
stateObservation::examples::offlineEKFFlexibilityEstimation
          (IndexedMatrixArray *y,IndexedMatrixArray *u,Matrix *xh0,uint numberOfContacts,
          vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          *contactsPositions,double dt,IndexedMatrixArray *ino,IndexedMatrixArray *premea)

{
  undefined4 *puVar1;
  uint uVar2;
  IndexedMatrixArray *pIVar3;
  DenseStorage<double,__1,__1,__1,_0> *pDVar4;
  DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *other;
  undefined4 in_register_0000000c;
  double *pdVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  IndexedMatrixArray *in_stack_00000010;
  Matrix Q;
  Matrix R;
  FixedContactEKFFlexEstimatorIMU estimator;
  void *local_618 [2];
  Matrix *local_608;
  Matrix<double,__1,__1,_0,__1,__1> local_600;
  IndexedMatrixArray *local_5e8;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_5e0;
  IndexedMatrixArray *local_5b8;
  _Deque_iterator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_&,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_*>
  *local_5b0;
  _Deque_iterator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_&,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_*>
  *local_5a8;
  Matrix<double,__1,__1,_0,__1,__1> local_5a0;
  undefined4 local_588;
  undefined4 uStack_584;
  undefined4 uStack_580;
  undefined4 uStack_57c;
  undefined8 local_578;
  FixedContactEKFFlexEstimatorIMU local_568 [1336];
  
  local_608 = xh0;
  stateObservation::flexibilityEstimation::FixedContactEKFFlexEstimatorIMU::
  FixedContactEKFFlexEstimatorIMU(local_568,0.005);
  stateObservation::flexibilityEstimation::EKFFlexibilityEstimatorBase::getEKF();
  stateObservation::KalmanFilterBase::getRmatrixIdentity();
  if (-1 < (local_5a0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_cols | local_5a0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_rows)) {
    local_5e0.m_rhs.m_rows.m_value =
         local_5a0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
    ;
    local_5e0.m_rhs.m_cols.m_value =
         local_5a0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
    ;
    local_5e0.m_rhs.m_functor.m_other = 1e-16;
    local_5e0.m_lhs = &local_5a0;
    Eigen::internal::
    call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>,Eigen::internal::assign_op<double,double>>
              (&local_5a0,&local_5e0,(assign_op<double,_double> *)&local_600);
    stateObservation::flexibilityEstimation::EKFFlexibilityEstimatorBase::getEKF();
    stateObservation::KalmanFilterBase::getQmatrixIdentity();
    if (-1 < (local_600.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_cols | local_600.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                       m_storage.m_rows)) {
      local_5e0.m_rhs.m_rows.m_value =
           local_600.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_rows;
      local_5e0.m_rhs.m_cols.m_value =
           local_600.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_cols;
      local_5e0.m_rhs.m_functor.m_other = 0.0001;
      local_5e0.m_lhs = &local_600;
      Eigen::internal::
      call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>,Eigen::internal::assign_op<double,double>>
                (&local_600,&local_5e0,(assign_op<double,_double> *)local_618);
      if ((8 < local_600.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
               m_rows) &&
         (8 < local_600.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_cols)) {
        pdVar5 = local_600.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data +
                 local_600.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows * 6 + 6;
        lVar8 = 0;
        do {
          lVar9 = 0;
          do {
            uVar11 = 0x47ae147b;
            uVar12 = 0x3f847ae1;
            if (lVar8 != lVar9) {
              uVar11 = 0;
              uVar12 = 0;
            }
            pdVar5[lVar9] = (double)CONCAT44(uVar12,uVar11);
            lVar9 = lVar9 + 1;
          } while (lVar9 != 3);
          lVar8 = lVar8 + 1;
          pdVar5 = pdVar5 + local_600.
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                            m_storage.m_rows;
        } while (lVar8 != 3);
        if ((0x11 < local_600.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_rows) &&
           (0x11 < local_600.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_cols)) {
          pdVar5 = local_600.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_data +
                   local_600.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_rows * 0xf + 0xf;
          lVar8 = 0;
          do {
            lVar9 = 0;
            do {
              uVar11 = 0x47ae147b;
              uVar12 = 0x3f847ae1;
              if (lVar8 != lVar9) {
                uVar11 = 0;
                uVar12 = 0;
              }
              pdVar5[lVar9] = (double)CONCAT44(uVar12,uVar11);
              lVar9 = lVar9 + 1;
            } while (lVar9 != 3);
            lVar8 = lVar8 + 1;
            pdVar5 = pdVar5 + local_600.
                              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                              m_storage.m_rows;
          } while (lVar8 != 3);
          local_5e8 = u;
          stateObservation::flexibilityEstimation::EKFFlexibilityEstimatorBase::
          setFlexibilityCovariance((Matrix *)local_568);
          stateObservation::flexibilityEstimation::FixedContactEKFFlexEstimatorIMU::
          setMeasurementNoiseCovariance((Matrix *)local_568);
          stateObservation::flexibilityEstimation::FixedContactEKFFlexEstimatorIMU::
          setProcessNoiseCovariance((Matrix *)local_568);
          stateObservation::flexibilityEstimation::FixedContactEKFFlexEstimatorIMU::
          setContactsNumber((uint)local_568);
          if ((int)contactsPositions != 0) {
            lVar8 = 0;
            iVar10 = 0;
            do {
              local_578 = *(undefined8 *)(*(long *)ino + 0x10 + lVar8);
              puVar1 = (undefined4 *)(*(long *)ino + lVar8);
              local_588 = *puVar1;
              uStack_584 = puVar1[1];
              uStack_580 = puVar1[2];
              uStack_57c = puVar1[3];
              stateObservation::flexibilityEstimation::FixedContactEKFFlexEstimatorIMU::
              setContactPosition(local_568,iVar10,&local_588);
              iVar10 = iVar10 + 1;
              lVar8 = lVar8 + 0x18;
            } while (((ulong)contactsPositions & 0xffffffff) * 0x18 != lVar8);
          }
          stateObservation::flexibilityEstimation::FixedContactEKFFlexEstimatorIMU::
          setFlexibilityGuess((Matrix *)local_568);
          stateObservation::IndexedMatrixArray::IndexedMatrixArray(y);
          pIVar3 = local_5e8;
          uVar7 = 0xffffffff;
          if ((*(long *)(local_5e8 + 0x38) - *(long *)(local_5e8 + 0x40) >> 3) * -0x5555555555555555
              + ((*(long *)(local_5e8 + 0x50) - *(long *)(local_5e8 + 0x30) >> 3) + -1 +
                (ulong)(*(long *)(local_5e8 + 0x50) == 0)) * 0x15 !=
              (*(long *)(local_5e8 + 0x28) - *(long *)(local_5e8 + 0x18) >> 3) * 0x5555555555555555)
          {
            uVar7 = *(uint *)local_5e8 - 1;
          }
          IndexedMatrixArray::setValue
                    (y,(Matrix *)CONCAT44(in_register_0000000c,numberOfContacts),uVar7);
          uVar7 = 0;
          if ((*(long *)(pIVar3 + 0x38) - *(long *)(pIVar3 + 0x40) >> 3) * -0x5555555555555555 +
              ((*(long *)(pIVar3 + 0x50) - *(long *)(pIVar3 + 0x30) >> 3) + -1 +
              (ulong)(*(long *)(pIVar3 + 0x50) == 0)) * 0x15 !=
              (*(long *)(pIVar3 + 0x28) - *(long *)(pIVar3 + 0x18) >> 3) * 0x5555555555555555) {
            uVar7 = *(uint *)pIVar3;
          }
          local_5a8 = (_Deque_iterator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_&,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_*>
                       *)(pIVar3 + 0x18);
          local_5b0 = (_Deque_iterator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_&,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_*>
                       *)(local_608 + 1);
          local_5b8 = y + 8;
          while( true ) {
            lVar8 = (*(long *)(local_5e8 + 0x28) - *(long *)(local_5e8 + 0x18) >> 3) *
                    -0x5555555555555555 +
                    (*(long *)(local_5e8 + 0x38) - *(long *)(local_5e8 + 0x40) >> 3) *
                    -0x5555555555555555 +
                    ((*(long *)(local_5e8 + 0x50) - *(long *)(local_5e8 + 0x30) >> 3) + -1 +
                    (ulong)(*(long *)(local_5e8 + 0x50) == 0)) * 0x15;
            uVar2 = *(uint *)local_5e8;
            uVar6 = (uVar2 - 1) + (int)lVar8;
            if (lVar8 == 0) {
              uVar6 = 0;
            }
            if (uVar6 < uVar7) {
              free(local_600.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_data);
              free(local_5a0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_data);
              stateObservation::flexibilityEstimation::FixedContactEKFFlexEstimatorIMU::
              ~FixedContactEKFFlexEstimatorIMU(local_568);
              return y;
            }
            if (((lVar8 == 0) || (uVar7 < uVar2)) || (lVar8 + (ulong)uVar2 <= (ulong)uVar7)) break;
            pDVar4 = (DenseStorage<double,__1,__1,__1,_0> *)
                     std::
                     _Deque_iterator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_&,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_*>
                     ::operator[](local_5a8,(ulong)(uVar7 - uVar2));
            Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
                      ((DenseStorage<double,__1,__1,__1,_0> *)&local_5e0,pDVar4);
            Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
            PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                      ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_618,
                       (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_5e0);
            stateObservation::flexibilityEstimation::FixedContactEKFFlexEstimatorIMU::setMeasurement
                      ((Matrix *)local_568);
            free(local_618[0]);
            free(local_5e0.m_lhs);
            lVar8 = local_608[3].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_rows;
            lVar8 = (local_608[1].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_cols -
                     (long)local_608[1].
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                           m_storage.m_data >> 3) * -0x5555555555555555 +
                    (local_608[2].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_rows -
                     local_608[2].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_cols >> 3) * -0x5555555555555555 +
                    ((lVar8 - (long)local_608[2].
                                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                    .m_storage.m_data >> 3) + -1 + (ulong)(lVar8 == 0)) * 0x15;
            if (lVar8 == 0) break;
            uVar2 = *(uint *)&(local_608->
                              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                              m_storage.m_data;
            if ((uVar7 < uVar2) || (lVar8 + (ulong)uVar2 <= (ulong)uVar7)) break;
            pDVar4 = (DenseStorage<double,__1,__1,__1,_0> *)
                     std::
                     _Deque_iterator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_&,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_*>
                     ::operator[](local_5b0,(ulong)(uVar7 - uVar2));
            Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
                      ((DenseStorage<double,__1,__1,__1,_0> *)&local_5e0,pDVar4);
            Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
            PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                      ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_618,
                       (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_5e0);
            stateObservation::flexibilityEstimation::EKFFlexibilityEstimatorBase::
            setMeasurementInput((Matrix *)local_568);
            free(local_618[0]);
            free(local_5e0.m_lhs);
            other = (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                    stateObservation::flexibilityEstimation::FixedContactEKFFlexEstimatorIMU::
                    getFlexibilityVector();
            Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
            PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>>
                      ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_5e0,other);
            if ((*(long *)(y + 0x38) - *(long *)(y + 0x40) >> 3) * -0x5555555555555555 +
                ((*(long *)(y + 0x50) - *(long *)(y + 0x30) >> 3) + -1 +
                (ulong)(*(long *)(y + 0x50) == 0)) * 0x15 ==
                (*(long *)(y + 0x28) - *(long *)(y + 0x18) >> 3) * 0x5555555555555555) {
              *(undefined4 *)y = 0;
            }
            std::
            deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
            ::push_back((deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                         *)local_5b8,(value_type *)&local_5e0);
            free(local_5e0.m_lhs);
            if (premea != (IndexedMatrixArray *)0x0) {
              stateObservation::flexibilityEstimation::EKFFlexibilityEstimatorBase::getInovation();
              Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
              PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>>
                        ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_5e0,
                         (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_618);
              IndexedMatrixArray::setValue(premea,(Matrix *)&local_5e0,uVar7);
              free(local_5e0.m_lhs);
              free(local_618[0]);
            }
            if (in_stack_00000010 != (IndexedMatrixArray *)0x0) {
              stateObservation::flexibilityEstimation::EKFFlexibilityEstimatorBase::
              getPredictedMeasurement();
              Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
              PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>>
                        ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_5e0,
                         (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_618);
              IndexedMatrixArray::setValue(in_stack_00000010,(Matrix *)&local_5e0,uVar7);
              free(local_5e0.m_lhs);
              free(local_618[0]);
            }
            uVar7 = uVar7 + 1;
          }
          __assert_fail("checkIndex(time) && \"Error: Time out of range\"",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/include/state-observation/tools/definitions.hxx"
                        ,0x9b,
                        "void stateObservation::IndexedMatrixArray::check_(unsigned int) const");
        }
      }
      __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                    ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                    "Eigen::Block<Eigen::Matrix<double, -1, -1>>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = -1, BlockCols = -1, InnerPanel = false]"
                   );
    }
  }
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, -1>]"
               );
}

Assistant:

stateObservation::IndexedMatrixArray offlineEKFFlexibilityEstimation(
            const stateObservation::IndexedMatrixArray & y,
            const stateObservation::IndexedMatrixArray & u,
            const Matrix & xh0,
            unsigned numberOfContacts,
            const std::vector<Vector3,Eigen::aligned_allocator<Vector3> > & contactsPositions,
            double dt,
            IndexedMatrixArray * ino,
            IndexedMatrixArray * premea)
{

    (void)dt;
        ///Sizes of the states for the state, the measurement, and the input vector

    flexibilityEstimation::FixedContactEKFFlexEstimatorIMU estimator;


    Matrix R(estimator.getEKF().getRmatrixIdentity());
    R=R*1.e-16;

    Matrix Q(estimator.getEKF().getQmatrixIdentity());
    Q=Q*1.e-4;
    Q.block(6,6,3,3)=Matrix3::Identity()*1.e-2;
    Q.block(15,15,3,3)=Matrix3::Identity()*1.e-2;


    estimator.setFlexibilityCovariance(Q);
    estimator.setMeasurementNoiseCovariance(R);
    estimator.setProcessNoiseCovariance(Q);


    estimator.setContactsNumber(numberOfContacts);

    for (unsigned i = 0; i<numberOfContacts ; ++i)
    {
        estimator.setContactPosition(i,contactsPositions[i]);
    }

    ///
    estimator.setFlexibilityGuess(xh0);

    ///the array of the state estimations over time
    stateObservation::IndexedMatrixArray xh;
    xh.setValue(xh0,y.getFirstIndex()-1);

    ///the reconstruction of the state
    for (unsigned i=y.getFirstIndex();i<=y.getLastIndex();++i)
    {
        //std::cout << i << std::endl;

        ///introduction of the measurement
        estimator.setMeasurement(y[i]);

        estimator.setMeasurementInput(u[i]);

        ///get the estimation and give it to the array
        xh.pushBack(estimator.getFlexibilityVector());

        if (ino != 0)
        {
            ino->setValue(estimator.getInovation(),i);
        }

        if (premea != 0)
        {
            premea->setValue(estimator.getPredictedMeasurement(),i);
        }

    }

    return xh;
}